

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O3

void anon_unknown.dwarf_b8b9::testDenormalizedRounding(int n)

{
  ushort uVar1;
  uint uVar2;
  ostream *poVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rounding denormalized numbers to ",0x21);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-bit precision\n",0xf);
  uVar5 = 0;
  local_50 = 0.0;
  if (n < 10) {
    uVar5 = (ulong)(10 - n);
    local_50 = (float)(double)((uVar5 << 0x34) + 0x3e600000001c5f68);
  }
  iVar7 = 200000;
  uVar6 = 0;
  fVar10 = 0.0;
  while( true ) {
    fVar11 = drand();
    fVar11 = fVar11 * 6.097555e-05;
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      if (half::_eLut[(uint)fVar11 >> 0x17] == 0) {
        uVar1 = half::convert((int)fVar11);
        uVar2 = (uint)uVar1;
      }
      else {
        uVar2 = (uint)half::_eLut[(uint)fVar11 >> 0x17] +
                (((uint)fVar11 & 0x7fffff) + 0xfff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
      }
    }
    else {
      uVar2 = (uint)fVar11 >> 0x10;
    }
    uVar8 = uVar2 ^ uVar6;
    uVar9 = uVar8;
    if ((uint)n < 10) {
      bVar4 = (byte)(9U - n);
      uVar2 = ((uVar2 & 0x7fff) >> (bVar4 & 0x1f)) +
              (uint)(((uVar2 & 0x7fff) >> (9U - n & 0x1f) & 1) != 0) << (bVar4 & 0x1f);
      uVar9 = uVar8 & -1 << ((byte)uVar5 & 0x1f);
      if ((uVar2 & 0xfc00) < 0x7c00) {
        uVar9 = uVar2;
      }
      uVar9 = uVar9 | uVar8 & 0xffff8000;
    }
    fVar12 = half::_toFloat[uVar9 & 0xffff].f - half::_toFloat[uVar8 & 0xffff].f;
    fVar11 = -fVar12;
    if (-fVar12 <= fVar12) {
      fVar11 = fVar12;
    }
    if (local_50 < fVar11) break;
    if (fVar11 <= fVar10) {
      fVar11 = fVar10;
    }
    uVar6 = uVar6 - 0x8000;
    iVar7 = iVar7 + -1;
    fVar10 = fVar11;
    if (iVar7 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max error          = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)fVar11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max expected error = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n\n",4);
      std::ostream::flush();
      return;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"half = ");
  poVar3 = operator<<(poVar3,(half)(unsigned_short)uVar8);
  poVar3 = std::operator<<(poVar3,", rounded = ");
  poVar3 = operator<<(poVar3,(half)(unsigned_short)uVar9);
  poVar3 = std::operator<<(poVar3,", error = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar11);
  poVar3 = std::operator<<(poVar3,", expected error = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_50);
  std::endl<char,std::char_traits<char>>(poVar3);
  printBits((ostream *)&std::cout,(half)(unsigned_short)uVar8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  printBits((ostream *)&std::cout,(half)(unsigned_short)uVar9);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testError.cpp"
                ,0xc6,"void (anonymous namespace)::testDenormalizedRounding(int)");
}

Assistant:

void
testDenormalizedRounding (int n)
{
    cout << "rounding denormalized numbers to " << n << "-bit precision\n";

    float eExpected = (n < 10)? HALF_MIN * 0.5f * (1 << (10 - n)): 0;
    float eMax = 0;

    for (int i = 0; i < 200000; i++)
    {
	half h (drand() * (HALF_NRM_MIN - HALF_MIN));

	if (i & 1)
	    h = -h;

	half r (h.round(n));
	float e = r - h;

	if (e < 0)
	    e = -e;

	if (e > eExpected)
	{
	    cout << "half = " << h <<
		    ", rounded = " << r <<
		    ", error = " << e <<
		    ", expected error = " << eExpected << endl;

	    printBits (cout, h);
	    cout << endl;
	    printBits (cout, r);
	    cout << endl;

	    assert (false);
	}

	if (e > eMax)
	    eMax = e;
    }

    cout << "max error          = " << eMax << endl;
    cout << "max expected error = " << eExpected << endl;
    cout << "ok\n\n" << flush;
}